

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::SamplingMode::SerializeWithCachedSizes
          (SamplingMode *this,CodedOutputStream *output)

{
  if (this->samplingmethod_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(1,this->samplingmethod_,output);
    return;
  }
  return;
}

Assistant:

void SamplingMode::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.SamplingMode)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // .CoreML.Specification.SamplingMode.Method samplingMethod = 1;
  if (this->samplingmethod() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      1, this->samplingmethod(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.SamplingMode)
}